

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

void __thiscall cmQtAutoGenerator::Logger::Warning(Logger *this,GenT genType,string *message)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  string *psVar4;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_88;
  string local_68;
  string local_48;
  
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  lVar3 = std::__cxx11::string::find((char)message,10);
  if (lVar3 == -1) {
    psVar4 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
    std::__cxx11::string::_M_append((char *)&local_88,(ulong)(psVar4->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_88);
  }
  else {
    psVar4 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + psVar4->_M_string_length);
    std::__cxx11::string::append((char *)&local_68);
    HeadLine(&local_48,&local_68);
    std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::_M_append((char *)&local_88,(ulong)(message->_M_dataplus)._M_p);
  if (local_88._M_dataplus._M_p[local_88._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&local_88);
  }
  std::__cxx11::string::push_back((char)&local_88);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    cmSystemTools::Stdout(&local_88);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void cmQtAutoGenerator::Logger::Warning(GenT genType,
                                        std::string const& message)
{
  std::string msg;
  if (message.find('\n') == std::string::npos) {
    // Single line message
    msg += GeneratorName(genType);
    msg += " warning: ";
  } else {
    // Multi line message
    msg += HeadLine(GeneratorName(genType) + " warning");
  }
  // Message
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stdout(msg);
  }
}